

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,int rounding_corners)

{
  uint uVar1;
  int iVar2;
  ImVec2 *pIVar3;
  int iVar4;
  int iVar5;
  ImVec2 *pIVar6;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar1 = ~rounding_corners;
  fVar8 = 0.5;
  if ((uVar1 & 0xc) != 0) {
    fVar8 = 1.0;
  }
  fVar10 = 0.5;
  if ((uVar1 & 3) != 0) {
    fVar10 = fVar8;
  }
  fVar8 = 0.5;
  if ((uVar1 & 6) != 0) {
    fVar8 = 1.0;
  }
  fVar7 = 0.5;
  if ((uVar1 & 9) != 0) {
    fVar7 = fVar8;
  }
  if (rounding_corners != 0) {
    fVar8 = (*a).x;
    fVar9 = (*a).y;
    fVar10 = ABS(b->x - fVar8) * fVar10 + -1.0;
    if (fVar10 <= rounding) {
      rounding = fVar10;
    }
    fVar10 = ABS(b->y - fVar9) * fVar7 + -1.0;
    if (fVar10 <= rounding) {
      rounding = fVar10;
    }
    if (0.0 < rounding) {
      fVar10 = 0.0;
      if ((rounding_corners & 1U) != 0) {
        fVar10 = rounding;
      }
      local_4c = 0.0;
      if ((rounding_corners & 2U) != 0) {
        local_4c = rounding;
      }
      local_48 = 0.0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      if ((rounding_corners & 4U) != 0) {
        local_48 = rounding;
        uStack_44 = in_XMM0_Db;
        uStack_40 = in_XMM0_Dc;
        uStack_3c = in_XMM0_Dd;
      }
      local_50 = 0.0;
      if ((rounding_corners & 8U) != 0) {
        local_50 = rounding;
      }
      local_58.x = fVar8 + fVar10;
      local_58.y = fVar9 + fVar10;
      PathArcToFast(this,&local_58,fVar10,6,9);
      local_58.y = a->y + local_4c;
      local_58.x = b->x - local_4c;
      PathArcToFast(this,&local_58,local_4c,9,0xc);
      local_58.x = (*b).x - local_48;
      local_58.y = (*b).y - local_48;
      PathArcToFast(this,&local_58,local_48,0,3);
      local_58.y = b->y - local_50;
      local_58.x = a->x + local_50;
      PathArcToFast(this,&local_58,local_50,3,6);
      return;
    }
  }
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar5 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar6 = (this->_Path).Data;
    if (pIVar6 == (ImVec2 *)0x0) {
      pIVar6 = (ImVec2 *)0x0;
    }
    else {
      memcpy(pIVar3,pIVar6,(long)(this->_Path).Size << 3);
      pIVar6 = (this->_Path).Data;
    }
    ImGui::MemFree(pIVar6);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar5;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2] = *a;
  fVar8 = b->x;
  fVar10 = a->y;
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar5 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    local_48 = fVar8;
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar6 = (this->_Path).Data;
    if (pIVar6 == (ImVec2 *)0x0) {
      pIVar6 = (ImVec2 *)0x0;
    }
    else {
      memcpy(pIVar3,pIVar6,(long)(this->_Path).Size << 3);
      pIVar6 = (this->_Path).Data;
    }
    ImGui::MemFree(pIVar6);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar5;
    iVar2 = (this->_Path).Size;
    fVar8 = local_48;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2].x = fVar8;
  pIVar3[iVar2].y = fVar10;
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar5 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar6 = (this->_Path).Data;
    if (pIVar6 == (ImVec2 *)0x0) {
      pIVar6 = (ImVec2 *)0x0;
    }
    else {
      memcpy(pIVar3,pIVar6,(long)(this->_Path).Size << 3);
      pIVar6 = (this->_Path).Data;
    }
    ImGui::MemFree(pIVar6);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar5;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2] = *b;
  fVar8 = a->x;
  fVar10 = b->y;
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar5 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar6 = (this->_Path).Data;
    if (pIVar6 == (ImVec2 *)0x0) {
      pIVar6 = (ImVec2 *)0x0;
    }
    else {
      memcpy(pIVar3,pIVar6,(long)(this->_Path).Size << 3);
      pIVar6 = (this->_Path).Data;
    }
    ImGui::MemFree(pIVar6);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar5;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2].x = fVar8;
  pIVar3[iVar2].y = fVar10;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, int rounding_corners)
{
    float r = rounding;
    r = ImMin(r, fabsf(b.x-a.x) * ( ((rounding_corners&(1|2))==(1|2)) || ((rounding_corners&(4|8))==(4|8)) ? 0.5f : 1.0f ) - 1.0f);
    r = ImMin(r, fabsf(b.y-a.y) * ( ((rounding_corners&(1|8))==(1|8)) || ((rounding_corners&(2|4))==(2|4)) ? 0.5f : 1.0f ) - 1.0f);

    if (r <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x,a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x,b.y));
    }
    else
    {
        const float r0 = (rounding_corners & 1) ? r : 0.0f;
        const float r1 = (rounding_corners & 2) ? r : 0.0f;
        const float r2 = (rounding_corners & 4) ? r : 0.0f;
        const float r3 = (rounding_corners & 8) ? r : 0.0f;
        PathArcToFast(ImVec2(a.x+r0,a.y+r0), r0, 6, 9);
        PathArcToFast(ImVec2(b.x-r1,a.y+r1), r1, 9, 12);
        PathArcToFast(ImVec2(b.x-r2,b.y-r2), r2, 0, 3);
        PathArcToFast(ImVec2(a.x+r3,b.y-r3), r3, 3, 6);
    }
}